

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O3

void __thiscall
polyscope::SlicePlane::setSceneObjectUniforms(SlicePlane *this,ShaderProgram *p,bool alwaysPass)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  undefined7 in_register_00000011;
  float fVar5;
  undefined1 auVar6 [16];
  undefined8 local_98;
  ulong local_88;
  ulong local_78;
  undefined8 local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((int)CONCAT71(in_register_00000011,alwaysPass) == 0) {
    bVar4 = (this->active).value;
    if (bVar4 == true) {
      uVar2 = (this->objectTransform).value.value[0].field_0;
      uVar3 = (this->objectTransform).value.value[0].field_1;
      fVar1 = (this->objectTransform).value.value[0].field_2.z;
      auVar6._0_4_ = (float)uVar2 * (float)uVar2;
      auVar6._4_4_ = (float)uVar3 * (float)uVar3;
      auVar6._8_8_ = 0;
      auVar6 = vhaddps_avx(auVar6,auVar6);
      auVar6 = ZEXT416((uint)(auVar6._0_4_ + fVar1 * fVar1));
      auVar6 = vsqrtss_avx(auVar6,auVar6);
      fVar5 = 1.0 / auVar6._0_4_;
      local_78 = (ulong)(uint)(fVar1 * fVar5);
      local_68 = CONCAT44((float)uVar3 * fVar5,(float)uVar2 * fVar5);
    }
    else {
      local_68 = SUB648(ZEXT464(0xbf800000),0);
      local_78 = 0;
    }
    local_88 = (ulong)((uint)(bVar4 & 1) * (int)(this->objectTransform).value.value[3].field_2);
    if (bVar4 == false) {
      local_98 = SUB648(ZEXT464(0x7f800000),0);
    }
    else {
      local_98 = SUB168((this->objectTransform).value.value[3],0);
    }
  }
  else {
    local_68 = SUB648(ZEXT464(0xbf800000),0);
    local_88 = 0;
    local_98 = SUB648(ZEXT464(0x7f800000),0);
    local_78 = 0;
  }
  std::operator+(&local_38,"u_slicePlaneNormal_",&this->postfix);
  (*p->_vptr_ShaderProgram[9])(local_68,local_78,p,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  std::operator+(&local_58,"u_slicePlaneCenter_",&this->postfix);
  (*p->_vptr_ShaderProgram[9])(local_98,local_88,p,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SlicePlane::setSceneObjectUniforms(render::ShaderProgram& p, bool alwaysPass) {
  glm::vec3 normal, center;

  if (alwaysPass) {
    normal = glm::vec3{-1., 0., 0.};
    center = glm::vec3{std::numeric_limits<float>::infinity(), 0., 0.};
  } else {
    normal = getNormal();
    center = getCenter();
  }

  p.setUniform("u_slicePlaneNormal_" + postfix, normal);
  p.setUniform("u_slicePlaneCenter_" + postfix, center);
}